

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O0

ze_result_t
zeRTASParallelOperationJoinExt(ze_rtas_parallel_operation_ext_handle_t hParallelOperation)

{
  ze_pfnRTASParallelOperationJoinExt_t p_Var1;
  __pointer_type p_Var2;
  ze_pfnRTASParallelOperationJoinExt_t pfnJoinExt;
  ze_rtas_parallel_operation_ext_handle_t hParallelOperation_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_ze_dditable_t_*>::load
                       ((atomic<_ze_dditable_t_*> *)(ze_lib::context + 0x10),memory_order_seq_cst);
    p_Var1 = (p_Var2->RTASParallelOperation).pfnJoinExt;
    if (p_Var1 == (ze_pfnRTASParallelOperationJoinExt_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hParallelOperation_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hParallelOperation_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hParallelOperation_local._4_4_ = (*p_Var1)(hParallelOperation);
    }
  }
  else {
    hParallelOperation_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hParallelOperation_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zeRTASParallelOperationJoinExt(
    ze_rtas_parallel_operation_ext_handle_t hParallelOperation  ///< [in] handle of parallel operation object
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const ze_pfnRTASParallelOperationJoinExt_t pfnJoinExt = [&result] {
        auto pfnJoinExt = ze_lib::context->zeDdiTable.load()->RTASParallelOperation.pfnJoinExt;
        if( nullptr == pfnJoinExt ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnJoinExt;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnJoinExt( hParallelOperation );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnJoinExt = ze_lib::context->zeDdiTable.load()->RTASParallelOperation.pfnJoinExt;
    if( nullptr == pfnJoinExt ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnJoinExt( hParallelOperation );
    #endif
}